

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O2

Corner __thiscall QSizeGripPrivate::corner(QSizeGripPrivate *this)

{
  QWidget *w;
  QWidgetData *pQVar1;
  bool bVar2;
  Corner CVar3;
  QWidget *parent;
  QPoint QVar4;
  long in_FS_OFFSET;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  w = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  parent = qt_sizegrip_topLevelWidget(w);
  local_20.xp.m_i = 0;
  local_20.yp.m_i = 0;
  QVar4 = QWidget::mapTo(w,parent,&local_20);
  pQVar1 = parent->data;
  bVar2 = (((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1) / 2 <= QVar4.yp.m_i.m_i;
  CVar3 = bVar2 + 1 + (uint)bVar2;
  if (QVar4.xp.m_i.m_i <= (((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1) / 2) {
    CVar3 = (uint)bVar2 * 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return CVar3;
  }
  __stack_chk_fail();
}

Assistant:

Qt::Corner QSizeGripPrivate::corner() const
{
    Q_Q(const QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(const_cast<QSizeGrip *>(q));
    const QPoint sizeGripPos = q->mapTo(tlw, QPoint(0, 0));
    bool isAtBottom = sizeGripPos.y() >= tlw->height() / 2;
    bool isAtLeft = sizeGripPos.x() <= tlw->width() / 2;
    if (isAtLeft)
        return isAtBottom ? Qt::BottomLeftCorner : Qt::TopLeftCorner;
    else
        return isAtBottom ? Qt::BottomRightCorner : Qt::TopRightCorner;
}